

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

CharItem ** __thiscall
Hpipe::Vec<Hpipe::CharItem*>::push_back<Hpipe::CharItem*&>
          (Vec<Hpipe::CharItem*> *this,CharItem **args)

{
  reference ppCVar1;
  CharItem **args_local;
  Vec<Hpipe::CharItem_*> *this_local;
  
  std::vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>>::emplace_back<Hpipe::CharItem*&>
            ((vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>> *)this,args);
  ppCVar1 = std::vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::back
                      ((vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)this);
  return ppCVar1;
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }